

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_create_header(Pager *pPager)

{
  Page *pPage;
  int rc;
  Page *pHeader;
  Pager *pPager_local;
  
  pPage = pager_alloc_page(pPager,0);
  if (pPage == (Page *)0x0) {
    pPager_local._4_4_ = -1;
  }
  else {
    pPager->pHeader = pPage;
    pager_link_page(pPager,pPage);
    pager_page_to_dirty_list(pPager,pPage);
    pPager_local._4_4_ = pager_write_db_header(pPager);
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_create_header(Pager *pPager)
{
	Page *pHeader;
	int rc;
	/* Allocate a new page */
	pHeader = pager_alloc_page(pPager,0);
	if( pHeader == 0 ){
		return UNQLITE_NOMEM;
	}
	pPager->pHeader = pHeader;
	/* Link the page */
	pager_link_page(pPager,pHeader);
	/* Add to the dirty list */
	pager_page_to_dirty_list(pPager,pHeader);
	/* Write the database header */
	rc = pager_write_db_header(pPager);
	return rc;
}